

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

void __thiscall DISTRHO::String::String(String *this,uint value,bool hexadecimal)

{
  char *__format;
  undefined7 in_register_00000011;
  char strBuf [256];
  char acStack_118 [255];
  undefined1 local_19;
  
  this->fBuffer = &_null()::sNull;
  this->fBufferLen = 0;
  this->fBufferAlloc = false;
  __format = "%u";
  if ((int)CONCAT71(in_register_00000011,hexadecimal) != 0) {
    __format = "0x%x";
  }
  snprintf(acStack_118,0xff,__format,value);
  local_19 = 0;
  _dup(this,(int)acStack_118);
  return;
}

Assistant:

explicit String(const unsigned int value, const bool hexadecimal = false) noexcept
        : fBuffer(_null()),
          fBufferLen(0),
          fBufferAlloc(false)
    {
        char strBuf[0xff+1];
        std::snprintf(strBuf, 0xff, hexadecimal ? "0x%x" : "%u", value);
        strBuf[0xff] = '\0';

        _dup(strBuf);
    }